

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

ExceptionOr<capnp::Capability::Client> * __thiscall
kj::_::ExceptionOr<capnp::Capability::Client>::operator=
          (ExceptionOr<capnp::Capability::Client> *this,
          ExceptionOr<capnp::Capability::Client> *param_1)

{
  Maybe<kj::Exception>::operator=((Maybe<kj::Exception> *)this,(Maybe<kj::Exception> *)param_1);
  Maybe<capnp::Capability::Client>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;